

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSearch.cpp
# Opt level: O0

RealType __thiscall
QuantLib::LineSearch::update
          (LineSearch *this,DynamicVector<double,_std::allocator<double>_> *params,
          DynamicVector<double,_std::allocator<double>_> *direction,RealType beta,
          Constraint *constraint)

{
  DynamicVector<double,_std::allocator<double>_> *in_RSI;
  double in_XMM0_Qa;
  int icount;
  bool valid;
  DynamicVector<double,_std::allocator<double>_> newParams;
  RealType diff;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffef8;
  Constraint *in_stack_ffffffffffffff00;
  DynamicVector<double,_std::allocator<double>_> *v1;
  Constraint local_90;
  int local_74;
  bool local_6d;
  DynamicVector<double,_std::allocator<double>_> local_60 [2];
  double local_30;
  
  v1 = local_60;
  local_30 = in_XMM0_Qa;
  OpenMD::operator*((double)v1,in_RSI);
  OpenMD::operator+(v1,in_RSI);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x306288);
  local_6d = Constraint::test(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_74 = 0;
  while (((local_6d ^ 0xffU) & 1) != 0) {
    if (200 < local_74) {
      snprintf(painCave.errMsg,2000,"can\'t update linesearch\n");
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    local_30 = local_30 * 0.5;
    local_74 = local_74 + 1;
    OpenMD::operator*((double)v1,in_RSI);
    OpenMD::operator+(v1,in_RSI);
    in_stack_ffffffffffffff00 = &local_90;
    OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
              ((DynamicVector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8);
    OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
              ((DynamicVector<double,_std::allocator<double>_> *)0x3063f2);
    OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
              ((DynamicVector<double,_std::allocator<double>_> *)0x3063fc);
    local_6d = Constraint::test(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  OpenMD::operator*((double)v1,in_RSI);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::operator+=
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x306484);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x30649f);
  return local_30;
}

Assistant:

RealType LineSearch::update(DynamicVector<RealType>& params,
                              const DynamicVector<RealType>& direction,
                              RealType beta, const Constraint& constraint) {
    RealType diff                     = beta;
    DynamicVector<RealType> newParams = params + diff * direction;
    bool valid                        = constraint.test(newParams);
    int icount                        = 0;
    while (!valid) {
      if (icount > 200) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "can't update linesearch\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      }
      diff *= 0.5;
      icount++;
      newParams = params + diff * direction;
      valid     = constraint.test(newParams);
    }
    params += diff * direction;
    return diff;
  }